

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_int>::__encodeArray
          (FastPForImpl<4U,_unsigned_int> *this,uint *in,size_t length,uint32_t *out,size_t *nvalue)

{
  undefined4 *puVar1;
  pointer pvVar2;
  iterator __position;
  bool bVar3;
  undefined1 auVar4 [16];
  uint *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint32_t k_1;
  uint bit;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint32_t k;
  FastPForImpl<4U,_unsigned_int> *pFVar9;
  byte *__src;
  long in_R10;
  uint32_t *puVar10;
  size_t nValue;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  byte *pbVar14;
  ulong uVar15;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar16 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined1 auVar39 [64];
  undefined1 in_ZMM5 [64];
  uint8_t bestb;
  uint8_t maxb;
  uint8_t bestcexcept;
  byte local_63;
  byte local_62;
  byte local_61;
  uint *local_60;
  uint32_t *local_58;
  uint local_4c;
  FastPForImpl<4U,_unsigned_int> *local_48;
  size_t *local_40;
  uint *local_38;
  undefined1 auVar19 [32];
  undefined1 auVar28 [64];
  
  local_58 = out;
  local_40 = nvalue;
  checkifdivisibleby(length,0x80);
  pvVar2 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = 8;
  do {
    lVar11 = *(long *)((long)pvVar2 + lVar7 + -8);
    if (*(long *)((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data + lVar7) != lVar11) {
      *(long *)((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data + lVar7) = lVar11;
    }
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 800);
  __src = (this->bytescontainer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start;
  puVar10 = local_58 + 1;
  pbVar14 = __src;
  local_48 = this;
  if (0x7f < (long)length) {
    local_38 = in + length;
    puVar5 = in + 0x80;
    do {
      pFVar9 = local_48;
      local_60 = puVar5;
      getBestBFromData(local_48,in,&local_63,&local_61,&local_62);
      *pbVar14 = local_63;
      pbVar14[1] = local_61;
      if (local_61 == 0) {
        pbVar14 = pbVar14 + 2;
      }
      else {
        uVar6 = (ulong)local_63;
        pbVar14[2] = local_62;
        pbVar14 = pbVar14 + 3;
        this_00 = (pFVar9->datatobepacked).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (local_62 - uVar6);
        lVar7 = 0;
        do {
          if ((uint)(1L << (uVar6 & 0x3f)) <= in[lVar7]) {
            local_4c = in[lVar7] >> (local_63 & 0x1f);
            __position._M_current =
                 (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(this_00,__position,&local_4c);
            }
            else {
              *__position._M_current = local_4c;
              (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            *pbVar14 = (byte)lVar7;
            pbVar14 = pbVar14 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x80);
      }
      bit = (uint)local_63;
      lVar7 = 0;
      uVar13 = (uint)local_63;
      do {
        fastpack((uint32_t *)((long)in + lVar7),puVar10,bit);
        lVar7 = lVar7 + 0x80;
        puVar10 = (uint32_t *)((long)puVar10 + (ulong)(uVar13 * 4));
      } while (lVar7 != 0x200);
      in = in + 0x80;
      puVar5 = local_60 + 0x80;
    } while (puVar5 <= local_38);
    __src = (local_48->bytescontainer).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  }
  pFVar9 = local_48;
  uVar13 = (int)pbVar14 - (int)__src;
  *local_58 = (uint32_t)((ulong)((long)puVar10 - (long)local_58) >> 2);
  *puVar10 = uVar13;
  uVar6 = (ulong)uVar13;
  memcpy(puVar10 + 1,__src,uVar6);
  uVar15 = uVar6 + 3 & 0xfffffffffffffffc;
  if (uVar6 < uVar15) {
    uVar12 = uVar6 + 5 + (long)puVar10;
    uVar8 = uVar15 + 4 + (long)puVar10;
    if (uVar8 < uVar12) {
      uVar8 = uVar12;
    }
    memset((void *)((long)(puVar10 + 1) + uVar6),0,(uVar8 - (uVar6 + (long)puVar10)) - 4);
  }
  auVar20 = vpmovsxbq_avx512f(ZEXT816(0x908070605040302));
  auVar21 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar22 = vpbroadcastq_avx512f(ZEXT816(0x1f));
  auVar23 = vpbroadcastq_avx512f(ZEXT816(0x18));
  auVar24 = vpbroadcastq_avx512f(ZEXT816(1));
  auVar25 = vpbroadcastq_avx512f(ZEXT816(8));
  pvVar2 = (pFVar9->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (undefined4 *)((long)puVar10 + uVar15 + 4);
  auVar39 = ZEXT1664((undefined1  [16])0x0);
  auVar26 = vpternlogd_avx512f(in_ZMM5,in_ZMM5,in_ZMM5,0xff);
  lVar7 = 0;
  do {
    auVar27 = vpbroadcastq_avx512f();
    vpmullq_avx512dq(auVar20,auVar23);
    lVar7 = lVar7 + 8;
    auVar27 = vporq_avx512f(auVar27,auVar21);
    uVar6 = vpcmpuq_avx512f(auVar27,auVar22,1);
    auVar28 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)&(pvVar2->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data + in_R10));
    auVar29._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar28._8_8_;
    auVar29._0_8_ = (ulong)((byte)uVar6 & 1) * auVar28._0_8_;
    auVar29._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar28._16_8_;
    auVar29._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar28._24_8_;
    auVar29._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar28._32_8_;
    auVar29._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar28._40_8_;
    auVar29._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar28._48_8_;
    auVar29._56_8_ = (uVar6 >> 7) * auVar28._56_8_;
    auVar28 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)&(pvVar2->
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          )._M_impl.super__Vector_impl_data + in_R10 + 8));
    auVar30._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar28._8_8_;
    auVar30._0_8_ = (ulong)((byte)uVar6 & 1) * auVar28._0_8_;
    auVar30._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar28._16_8_;
    auVar30._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar28._24_8_;
    auVar30._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar28._32_8_;
    auVar30._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar28._40_8_;
    auVar30._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar28._48_8_;
    auVar30._56_8_ = (uVar6 >> 7) * auVar28._56_8_;
    uVar6 = vpcmpq_avx512f(auVar30,auVar29,4);
    auVar28 = vpaddq_avx512f(auVar20,auVar26);
    auVar20 = vpaddq_avx512f(auVar20,auVar25);
    auVar28 = vpsllvq_avx512f(auVar24,auVar28);
    auVar17 = vpmovqd_avx512f(auVar28);
    auVar17 = vpord_avx512vl(auVar39._0_32_,auVar17);
    bVar3 = (bool)((byte)uVar6 & 1);
    iVar31 = auVar39._0_4_;
    auVar18._0_4_ = (uint)bVar3 * auVar17._0_4_ | (uint)!bVar3 * iVar31;
    bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
    iVar32 = auVar39._4_4_;
    auVar18._4_4_ = (uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * iVar32;
    bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
    iVar33 = auVar39._8_4_;
    auVar18._8_4_ = (uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * iVar33;
    bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
    iVar34 = auVar39._12_4_;
    auVar18._12_4_ = (uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * iVar34;
    bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
    iVar35 = auVar39._16_4_;
    auVar18._16_4_ = (uint)bVar3 * auVar17._16_4_ | (uint)!bVar3 * iVar35;
    bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
    iVar36 = auVar39._20_4_;
    auVar18._20_4_ = (uint)bVar3 * auVar17._20_4_ | (uint)!bVar3 * iVar36;
    bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
    iVar37 = auVar39._24_4_;
    auVar18._24_4_ = (uint)bVar3 * auVar17._24_4_ | (uint)!bVar3 * iVar37;
    bVar3 = SUB81(uVar6 >> 7,0);
    iVar38 = auVar39._28_4_;
    auVar18._28_4_ = (uint)bVar3 * auVar17._28_4_ | (uint)!bVar3 * iVar38;
    auVar39 = ZEXT3264(auVar18);
  } while (lVar7 != 0x20);
  auVar20._8_8_ = 0x1f;
  auVar20._0_8_ = 0x1f;
  auVar20._16_8_ = 0x1f;
  auVar20._24_8_ = 0x1f;
  auVar20._32_8_ = 0x1f;
  auVar20._40_8_ = 0x1f;
  auVar20._48_8_ = 0x1f;
  auVar20._56_8_ = 0x1f;
  uVar6 = vpcmpuq_avx512f(auVar27,auVar20,1);
  lVar7 = 2;
  local_60 = (uint *)0x8;
  auVar17 = vmovdqa32_avx512vl(auVar18);
  bVar3 = (bool)((byte)uVar6 & 1);
  auVar16._0_4_ = (uint)bVar3 * auVar17._0_4_ | (uint)!bVar3 * iVar31;
  bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar16._4_4_ = (uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * iVar32;
  bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar16._8_4_ = (uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * iVar33;
  bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar16._12_4_ = (uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * iVar34;
  bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
  auVar19._16_4_ = (uint)bVar3 * auVar17._16_4_ | (uint)!bVar3 * iVar35;
  auVar19._0_16_ = auVar16;
  bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
  auVar19._20_4_ = (uint)bVar3 * auVar17._20_4_ | (uint)!bVar3 * iVar36;
  bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
  auVar19._24_4_ = (uint)bVar3 * auVar17._24_4_ | (uint)!bVar3 * iVar37;
  bVar3 = SUB81(uVar6 >> 7,0);
  auVar19._28_4_ = (uint)bVar3 * auVar17._28_4_ | (uint)!bVar3 * iVar38;
  auVar16 = vpor_avx(auVar16,auVar19._16_16_);
  auVar4 = vpshufd_avx(auVar16,0xee);
  auVar16 = vpor_avx(auVar16,auVar4);
  auVar4 = vpshufd_avx(auVar16,0x55);
  auVar16 = vpor_avx(auVar16,auVar4);
  *puVar1 = auVar16._0_4_;
  puVar10 = puVar1 + 1;
  do {
    pvVar2 = (pFVar9->datatobepacked).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)*(pointer *)
                    ((long)&pvVar2[lVar7].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data + 8) -
             *(long *)&pvVar2[lVar7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data;
    if (lVar11 != 0) {
      uVar12 = lVar11 >> 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (pvVar2 + lVar7,uVar12 + 0x1f & 0xffffffffffffffe0);
      lVar11 = *(long *)&(pFVar9->datatobepacked).
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar7].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data;
      *puVar10 = (uint32_t)uVar12;
      puVar10 = puVar10 + 1;
      uVar13 = 0;
      uVar6 = 0;
      uVar15 = 0x20;
      do {
        fastpackwithoutmask((uint32_t *)(lVar11 + uVar6 * 4),puVar10,(uint32_t)lVar7);
        puVar10 = (uint32_t *)((long)puVar10 + (long)local_60);
        uVar13 = uVar13 + 0x20;
        bVar3 = uVar15 < uVar12;
        uVar6 = uVar15;
        uVar15 = (ulong)((int)uVar15 + 0x20);
      } while (bVar3);
      puVar10 = puVar10 + -((uVar13 - uVar12) * lVar7 >> 5);
      pFVar9 = local_48;
    }
    lVar7 = lVar7 + 1;
    local_60 = (uint *)((long)local_60 + 4);
  } while (lVar7 != 0x21);
  *local_40 = (long)puVar10 - (long)local_58 >> 2;
  return;
}

Assistant:

void __encodeArray(const IntType *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out;  // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++;  // keep track of this
    for (uint32_t k = 0; k < sizeof(IntType) * 8 + 1; ++k) {
      datatobepacked[k].clear();
    }
    uint8_t *bc = &bytescontainer[0];
    for (const IntType *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        *bc++ = maxb;
        std::vector<IntType> &thisexceptioncontainer =
            datatobepacked[maxb - bestb];
        const IntType maxval = static_cast<IntType>(1ULL << bestb);
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            // we have an exception
            thisexceptioncontainer.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    IntType bitmap = 0;
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() != 0) bitmap |= (1ULL << (k - 1));
    }
    *(reinterpret_cast<IntType *>(out)) = bitmap;
    out += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);

    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if (datatobepacked[k].size() > 0) {
        size_t nValue = datatobepacked[k].size();
        datatobepacked[k].resize((datatobepacked[k].size() + 32 - 1) / 32 * 32);
        out = packingvector<32>::packmeuptightwithoutmask(
            datatobepacked[k].data(), nValue, out, k);
      }
    }
    nvalue = out - initout;
  }